

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<unsigned_char>::setCapacity(Vector<unsigned_char> *this,size_t newSize)

{
  uchar *puVar1;
  ArrayBuilder<unsigned_char> newBuilder;
  ArrayBuilder<unsigned_char> local_30;
  
  puVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)puVar1)) {
    (this->builder).pos = puVar1 + newSize;
  }
  local_30.ptr = _::HeapArrayDisposer::allocateUninitialized<unsigned_char>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<unsigned_char>::addAll<kj::ArrayBuilder<unsigned_char>>(&local_30,&this->builder);
  ArrayBuilder<unsigned_char>::operator=(&this->builder,&local_30);
  ArrayBuilder<unsigned_char>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }